

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O2

int parse_switches(j_compress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,boolean for_real
                  )

{
  int *piVar1;
  char **ppcVar2;
  boolean bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  char *__format;
  char *unaff_R13;
  JXFORM_CODE JVar8;
  char ch;
  j_compress_ptr local_60;
  char **local_58;
  int local_4c;
  long lval;
  int local_3c;
  char *local_38;
  
  icc_filename = (char *)0x0;
  max_scans = 0;
  outfilename = (char *)0x0;
  report = 0;
  strict = 0;
  copyoption = JCOPYOPT_COMMENTS;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = 0;
  transformoption.trim = 0;
  transformoption.force_grayscale = 0;
  transformoption.crop = 0;
  transformoption.slow_hflip = 0;
  cinfo->err->trace_level = 0;
  local_4c = 0;
  local_38 = (char *)0x0;
  local_60 = cinfo;
  local_58 = argv;
  local_3c = last_file_arg_seen;
  for (iVar7 = 1; pcVar6 = local_38, iVar7 < argc; iVar7 = iVar7 + 1) {
    unaff_R13 = argv[iVar7];
    if (*unaff_R13 == '-') {
      unaff_R13 = unaff_R13 + 1;
      bVar3 = keymatch(unaff_R13,"arithmetic",1);
      if (bVar3 == 0) {
        bVar3 = keymatch(unaff_R13,"copy",2);
        ppcVar2 = local_58;
        if (bVar3 == 0) {
          bVar3 = keymatch(unaff_R13,"crop",2);
          cinfo = local_60;
          if (bVar3 == 0) {
            bVar3 = keymatch(unaff_R13,"drop",2);
            cinfo = local_60;
            if (bVar3 == 0) {
              bVar3 = keymatch(unaff_R13,"debug",1);
              if ((bVar3 == 0) && (bVar3 = keymatch(unaff_R13,"verbose",1), bVar3 == 0)) {
                bVar3 = keymatch(unaff_R13,"version",4);
                cinfo = local_60;
                if (bVar3 != 0) {
                  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                  exit(0);
                }
                bVar3 = keymatch(unaff_R13,"flip",1);
                if (bVar3 == 0) {
                  bVar3 = keymatch(unaff_R13,"grayscale",1);
                  if ((bVar3 == 0) && (bVar3 = keymatch(unaff_R13,"greyscale",1), bVar3 == 0)) {
                    bVar3 = keymatch(unaff_R13,"icc",1);
                    if (bVar3 == 0) {
                      bVar3 = keymatch(unaff_R13,"maxmemory",3);
                      if (bVar3 == 0) {
                        bVar3 = keymatch(unaff_R13,"maxscans",4);
                        if (bVar3 == 0) {
                          bVar3 = keymatch(unaff_R13,"optimize",1);
                          if ((bVar3 == 0) && (bVar3 = keymatch(unaff_R13,"optimise",1), bVar3 == 0)
                             ) {
                            bVar3 = keymatch(unaff_R13,"outfile",4);
                            if (bVar3 == 0) {
                              bVar3 = keymatch(unaff_R13,"perfect",2);
                              if (bVar3 == 0) {
                                bVar3 = keymatch(unaff_R13,"progressive",2);
                                if (bVar3 == 0) {
                                  bVar3 = keymatch(unaff_R13,"report",3);
                                  if (bVar3 == 0) {
                                    bVar3 = keymatch(unaff_R13,"restart",1);
                                    if (bVar3 == 0) {
                                      bVar3 = keymatch(unaff_R13,"rotate",2);
                                      if (bVar3 == 0) {
                                        bVar3 = keymatch(unaff_R13,"scans",1);
                                        if (bVar3 != 0) {
                                          if (iVar7 + 1 < argc) {
                                            local_38 = local_58[iVar7 + 1];
                                            goto LAB_00105eab;
                                          }
                                          goto LAB_00106189;
                                        }
                                        bVar3 = keymatch(unaff_R13,"strict",2);
                                        if (bVar3 != 0) {
                                          strict = 1;
                                          cinfo = local_60;
                                          argv = local_58;
                                          goto LAB_001059dc;
                                        }
                                        bVar3 = keymatch(unaff_R13,"transpose",1);
                                        if (bVar3 == 0) {
                                          bVar3 = keymatch(unaff_R13,"transverse",6);
                                          if (bVar3 == 0) {
                                            bVar3 = keymatch(unaff_R13,"trim",3);
                                            if (bVar3 != 0) {
                                              transformoption.trim = 1;
                                              cinfo = local_60;
                                              argv = local_58;
                                              goto LAB_001059dc;
                                            }
                                            bVar3 = keymatch(unaff_R13,"wipe",1);
                                            if ((bVar3 == 0) || (iVar7 = iVar7 + 1, argc <= iVar7))
                                            goto LAB_00106189;
                                            unaff_R13 = (char *)(long)iVar7;
                                            if ((transformoption.crop != 0) ||
                                               (bVar3 = jtransform_parse_crop_spec
                                                                  (&transformoption,
                                                                   local_58[(long)unaff_R13]),
                                               bVar3 == 0)) {
                                              pcVar6 = local_58[(long)unaff_R13];
                                              __format = "%s: bogus -wipe argument \'%s\'\n";
                                              goto LAB_001061c8;
                                            }
                                            JVar8 = JXFORM_WIPE;
                                          }
                                          else {
                                            JVar8 = JXFORM_TRANSVERSE;
                                          }
                                        }
                                        else {
                                          JVar8 = JXFORM_TRANSPOSE;
                                        }
                                      }
                                      else {
                                        iVar7 = iVar7 + 1;
                                        if (argc <= iVar7) goto LAB_00106189;
                                        unaff_R13 = (char *)(long)iVar7;
                                        bVar3 = keymatch(local_58[(long)unaff_R13],"90",2);
                                        if (bVar3 == 0) {
                                          bVar3 = keymatch(local_58[(long)unaff_R13],"180",3);
                                          if (bVar3 == 0) {
                                            bVar3 = keymatch(local_58[(long)unaff_R13],"270",3);
                                            if (bVar3 == 0) goto LAB_00106189;
                                            JVar8 = JXFORM_ROT_270;
                                          }
                                          else {
                                            JVar8 = JXFORM_ROT_180;
                                          }
                                        }
                                        else {
                                          JVar8 = JXFORM_ROT_90;
                                        }
                                      }
                                      select_transform(JVar8);
                                      cinfo = local_60;
                                      argv = local_58;
                                    }
                                    else {
                                      ch = 'x';
                                      iVar7 = iVar7 + 1;
                                      if (((argc <= iVar7) ||
                                          (iVar4 = __isoc99_sscanf(local_58[iVar7],"%ld%c",&lval,&ch
                                                                  ), iVar4 < 1)) ||
                                         (0xffff < (ulong)lval)) goto LAB_00106189;
                                      lVar5 = lval;
                                      if ((ch & 0xdfU) == 0x42) {
                                        local_60->restart_interval = (uint)lval;
                                        lVar5 = 0;
                                      }
                                      local_60->restart_in_rows = (int)lVar5;
                                      cinfo = local_60;
                                      argv = local_58;
                                    }
                                  }
                                  else {
                                    report = 1;
                                    cinfo = local_60;
                                    argv = local_58;
                                  }
                                }
                                else {
                                  local_4c = 1;
                                  cinfo = local_60;
                                  argv = local_58;
                                }
                              }
                              else {
                                transformoption.perfect = 1;
                                cinfo = local_60;
                                argv = local_58;
                              }
                            }
                            else {
                              if (argc <= iVar7 + 1) goto LAB_00106189;
                              outfilename = local_58[iVar7 + 1];
LAB_00105eab:
                              iVar7 = iVar7 + 1;
                              cinfo = local_60;
                              argv = local_58;
                            }
                          }
                          else {
                            cinfo->optimize_coding = 1;
                          }
                        }
                        else {
                          iVar7 = iVar7 + 1;
                          if ((argc <= iVar7) ||
                             (iVar4 = __isoc99_sscanf(argv[iVar7],"%u",&max_scans), iVar4 != 1))
                          goto LAB_00106189;
                        }
                      }
                      else {
                        ch = 'x';
                        iVar7 = iVar7 + 1;
                        if ((argc <= iVar7) ||
                           (iVar4 = __isoc99_sscanf(argv[iVar7],"%ld%c",&lval,&ch), iVar4 < 1))
                        goto LAB_00106189;
                        lVar5 = lval * 1000;
                        if ((ch & 0xdfU) != 0x4d) {
                          lVar5 = lval;
                        }
                        cinfo->mem->max_memory_to_use = lVar5 * 1000;
                      }
                    }
                    else {
                      iVar7 = iVar7 + 1;
                      if (argc <= iVar7) goto LAB_00106189;
                      icc_filename = argv[iVar7];
                    }
                  }
                  else {
                    transformoption.force_grayscale = 1;
                  }
                }
                else {
                  iVar7 = iVar7 + 1;
                  if (argc <= iVar7) goto LAB_00106189;
                  unaff_R13 = (char *)(long)iVar7;
                  JVar8 = JXFORM_FLIP_H;
                  bVar3 = keymatch(argv[(long)unaff_R13],"horizontal",1);
                  if ((bVar3 == 0) &&
                     (bVar3 = keymatch(argv[(long)unaff_R13],"vertical",1), JVar8 = JXFORM_FLIP_V,
                     bVar3 == 0)) goto LAB_00106189;
                  select_transform(JVar8);
                }
              }
              else {
                cinfo = local_60;
                if (parse_switches_printed_version == '\0') {
                  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                  fprintf(_stderr,"%s\n\n",
                          "Copyright (C) 2009-2021 D. R. Commander\nCopyright (C) 2015, 2020 Google, Inc.\nCopyright (C) 2019-2020 Arm Limited\nCopyright (C) 2015-2016, 2018 Matthieu Darbois\nCopyright (C) 2011-2016 Siarhei Siamashka\nCopyright (C) 2015 Intel Corporation\nCopyright (C) 2013-2014 Linaro Limited\nCopyright (C) 2013-2014 MIPS Technologies, Inc.\nCopyright (C) 2009, 2012 Pierre Ossman for Cendio AB\nCopyright (C) 2009-2011 Nokia Corporation and/or its subsidiary(-ies)\nCopyright (C) 1999-2006 MIYASAKA Masaru\nCopyright (C) 1991-2020 Thomas G. Lane, Guido Vollbeding"
                         );
                  fprintf(_stderr,"Emulating The Independent JPEG Group\'s software, version %s\n\n"
                          ,"6b  27-Mar-1998");
                  parse_switches_printed_version = '\x01';
                }
                piVar1 = &cinfo->err->trace_level;
                *piVar1 = *piVar1 + 1;
              }
            }
            else {
              if (argc <= iVar7 + 1) goto LAB_00106189;
              unaff_R13 = (char *)(long)(iVar7 + 1);
              if ((((transformoption.crop != 0) ||
                   (bVar3 = jtransform_parse_crop_spec(&transformoption,argv[(long)unaff_R13]),
                   bVar3 == 0)) || (transformoption.crop_width_set != JCROP_UNSET)) ||
                 (transformoption.crop_height_set != JCROP_UNSET)) {
                pcVar6 = argv[(long)unaff_R13];
                __format = "%s: bogus -drop argument \'%s\'\n";
                goto LAB_001061c8;
              }
              iVar7 = iVar7 + 2;
              if (argc <= iVar7) goto LAB_00106189;
              dropfilename = argv[iVar7];
              select_transform(JXFORM_DROP);
            }
          }
          else {
            iVar7 = iVar7 + 1;
            if (argc <= iVar7) goto LAB_00106189;
            unaff_R13 = (char *)(long)iVar7;
            if ((transformoption.crop != 0) ||
               (bVar3 = jtransform_parse_crop_spec(&transformoption,argv[(long)unaff_R13]),
               bVar3 == 0)) goto LAB_0010618e;
          }
        }
        else {
          iVar7 = iVar7 + 1;
          if (argc <= iVar7) goto LAB_00106189;
          unaff_R13 = (char *)(long)iVar7;
          bVar3 = keymatch(local_58[(long)unaff_R13],"none",1);
          argv = ppcVar2;
          if (bVar3 == 0) {
            bVar3 = keymatch(ppcVar2[(long)unaff_R13],"comments",1);
            if (bVar3 == 0) {
              bVar3 = keymatch(ppcVar2[(long)unaff_R13],"icc",1);
              if (bVar3 == 0) {
                bVar3 = keymatch(ppcVar2[(long)unaff_R13],"all",1);
                if (bVar3 == 0) goto LAB_00106189;
                copyoption = JCOPYOPT_ALL;
                cinfo = local_60;
                argv = local_58;
              }
              else {
                copyoption = JCOPYOPT_ICC;
                cinfo = local_60;
              }
            }
            else {
              copyoption = JCOPYOPT_COMMENTS;
              cinfo = local_60;
            }
          }
          else {
            copyoption = JCOPYOPT_NONE;
            cinfo = local_60;
          }
        }
      }
      else {
        cinfo->arith_code = 1;
      }
    }
    else {
      if (0 < iVar7) break;
      outfilename = (char *)0x0;
    }
LAB_001059dc:
  }
  if (local_3c != 0) {
    if (local_4c != 0) {
      jpeg_simple_progression(cinfo);
    }
    if ((pcVar6 != (char *)0x0) && (bVar3 = read_scan_script(cinfo,pcVar6), bVar3 == 0)) {
LAB_00106189:
      usage();
LAB_0010618e:
      pcVar6 = argv[(long)unaff_R13];
      __format = "%s: bogus -crop argument \'%s\'\n";
LAB_001061c8:
      fprintf(_stderr,__format,progname,pcVar6);
      exit(1);
    }
  }
  return iVar7;
}

Assistant:

LOCAL(int)
parse_switches(j_compress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;
  boolean simple_progressive;
  char *scansarg = NULL;        /* saves -scans parm if any */

  /* Set up default JPEG parameters. */
  simple_progressive = FALSE;
  icc_filename = NULL;
  max_scans = 0;
  outfilename = NULL;
  report = FALSE;
  strict = FALSE;
  copyoption = JCOPYOPT_DEFAULT;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = FALSE;
  transformoption.trim = FALSE;
  transformoption.force_grayscale = FALSE;
  transformoption.crop = FALSE;
  transformoption.slow_hflip = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "arithmetic", 1)) {
      /* Use arithmetic coding. */
#ifdef C_ARITH_CODING_SUPPORTED
      cinfo->arith_code = TRUE;
#else
      fprintf(stderr, "%s: sorry, arithmetic coding not supported\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "copy", 2)) {
      /* Select which extra markers to copy. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "none", 1)) {
        copyoption = JCOPYOPT_NONE;
      } else if (keymatch(argv[argn], "comments", 1)) {
        copyoption = JCOPYOPT_COMMENTS;
      } else if (keymatch(argv[argn], "icc", 1)) {
        copyoption = JCOPYOPT_ICC;
      } else if (keymatch(argv[argn], "all", 1)) {
        copyoption = JCOPYOPT_ALL;
      } else
        usage();

    } else if (keymatch(arg, "crop", 2)) {
      /* Perform lossless cropping. */
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -crop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "drop", 2)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn]) ||
          transformoption.crop_width_set != JCROP_UNSET ||
          transformoption.crop_height_set != JCROP_UNSET) {
        fprintf(stderr, "%s: bogus -drop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      if (++argn >= argc)       /* advance to next argument */
        usage();
      dropfilename = argv[argn];
      select_transform(JXFORM_DROP);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "flip", 1)) {
      /* Mirror left-right or top-bottom. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "horizontal", 1))
        select_transform(JXFORM_FLIP_H);
      else if (keymatch(argv[argn], "vertical", 1))
        select_transform(JXFORM_FLIP_V);
      else
        usage();

    } else if (keymatch(arg, "grayscale", 1) ||
               keymatch(arg, "greyscale", 1)) {
      /* Force to grayscale. */
#if TRANSFORMS_SUPPORTED
      transformoption.force_grayscale = TRUE;
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "maxscans", 4)) {
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u", &max_scans) != 1)
        usage();

    } else if (keymatch(arg, "optimize", 1) || keymatch(arg, "optimise", 1)) {
      /* Enable entropy parm optimization. */
#ifdef ENTROPY_OPT_SUPPORTED
      cinfo->optimize_coding = TRUE;
#else
      fprintf(stderr, "%s: sorry, entropy optimization was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "perfect", 2)) {
      /* Fail if there is any partial edge MCUs that the transform can't
       * handle. */
      transformoption.perfect = TRUE;

    } else if (keymatch(arg, "progressive", 2)) {
      /* Select simple progressive mode. */
#ifdef C_PROGRESSIVE_SUPPORTED
      simple_progressive = TRUE;
      /* We must postpone execution until num_components is known. */
#else
      fprintf(stderr, "%s: sorry, progressive output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "report", 3)) {
      report = TRUE;

    } else if (keymatch(arg, "restart", 1)) {
      /* Restart interval in MCU rows (or in MCUs with 'b'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (lval < 0 || lval > 65535L)
        usage();
      if (ch == 'b' || ch == 'B') {
        cinfo->restart_interval = (unsigned int)lval;
        cinfo->restart_in_rows = 0; /* else prior '-restart n' overrides me */
      } else {
        cinfo->restart_in_rows = (int)lval;
        /* restart_interval will be computed during startup */
      }

    } else if (keymatch(arg, "rotate", 2)) {
      /* Rotate 90, 180, or 270 degrees (measured clockwise). */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "90", 2))
        select_transform(JXFORM_ROT_90);
      else if (keymatch(argv[argn], "180", 3))
        select_transform(JXFORM_ROT_180);
      else if (keymatch(argv[argn], "270", 3))
        select_transform(JXFORM_ROT_270);
      else
        usage();

    } else if (keymatch(arg, "scans", 1)) {
      /* Set scan script. */
#ifdef C_MULTISCAN_FILES_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      scansarg = argv[argn];
      /* We must postpone reading the file in case -progressive appears. */
#else
      fprintf(stderr, "%s: sorry, multi-scan output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "strict", 2)) {
      strict = TRUE;

    } else if (keymatch(arg, "transpose", 1)) {
      /* Transpose (across UL-to-LR axis). */
      select_transform(JXFORM_TRANSPOSE);

    } else if (keymatch(arg, "transverse", 6)) {
      /* Transverse transpose (across UR-to-LL axis). */
      select_transform(JXFORM_TRANSVERSE);

    } else if (keymatch(arg, "trim", 3)) {
      /* Trim off any partial edge MCUs that the transform can't handle. */
      transformoption.trim = TRUE;

    } else if (keymatch(arg, "wipe", 1)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -wipe argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      select_transform(JXFORM_WIPE);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else {
      usage();                  /* bogus switch */
    }
  }

  /* Post-switch-scanning cleanup */

  if (for_real) {

#ifdef C_PROGRESSIVE_SUPPORTED
    if (simple_progressive)     /* process -progressive; -scans can override */
      jpeg_simple_progression(cinfo);
#endif

#ifdef C_MULTISCAN_FILES_SUPPORTED
    if (scansarg != NULL)       /* process -scans if it was present */
      if (!read_scan_script(cinfo, scansarg))
        usage();
#endif
  }

  return argn;                  /* return index of next arg (file name) */
}